

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandRecStart3(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char **__filename;
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  uint local_68;
  uint local_64;
  int fVerbose;
  int fFuncOnly;
  int nCuts;
  int nVars;
  Gia_Man_t *pGia;
  FILE *pFile;
  int nArgcNew;
  int c;
  char **pArgvNew;
  char *pTemp;
  char *FileName;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  _nCuts = (Gia_Man_t *)0x0;
  fFuncOnly = 6;
  fVerbose = 0x20;
  local_64 = 0;
  local_68 = 0;
  Extra_UtilGetoptReset();
  do {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"KCfvh");
      if (iVar1 == -1) {
        if ((fFuncOnly < 3) || (0x10 < fFuncOnly)) {
          Abc_Print(-1,"The range of allowed values is 3 <= K <= 16.\n");
          return 0;
        }
        iVar1 = Abc_NtkRecIsRunning3();
        if (iVar1 != 0) {
          Abc_Print(-1,"The AIG subgraph recording is already started.\n");
          return 0;
        }
        if (argc - globalUtilOptind == 1) {
          __filename = (char **)argv[globalUtilOptind];
          for (pArgvNew = __filename; *(char *)pArgvNew != '\0';
              pArgvNew = (char **)((long)pArgvNew + 1)) {
            if (*(char *)pArgvNew == '>') {
              *(undefined1 *)pArgvNew = 0x5c;
            }
          }
          __stream = fopen((char *)__filename,"r");
          if (__stream == (FILE *)0x0) {
            Abc_Print(-1,"Cannot open input file \"%s\". ",__filename);
            pcVar2 = Extra_FileGetSimilarName
                               ((char *)__filename,".aig",(char *)0x0,(char *)0x0,(char *)0x0,
                                (char *)0x0);
            if (pcVar2 != (char *)0x0) {
              Abc_Print(1,"Did you mean \"%s\"?",pcVar2);
            }
            Abc_Print(1,"\n");
            return 1;
          }
          fclose(__stream);
          _nCuts = Gia_AigerRead((char *)__filename,0,1,0);
          if (_nCuts == (Gia_Man_t *)0x0) {
            Abc_Print(-1,"Reading AIGER has failed.\n");
            return 0;
          }
        }
        else {
          Abc_Print(1,"File name is not given on the command line. Starting a new record.\n");
        }
        Abc_NtkRecStart3(_nCuts,fFuncOnly,fVerbose,local_64,local_68);
        return 0;
      }
      if (iVar1 == 0x43) break;
      if (iVar1 == 0x4b) {
        if (argc <= globalUtilOptind) {
          Abc_Print(-1,"Command line switch \"-K\" should be followed by an integer.\n");
          goto LAB_0023e444;
        }
        fFuncOnly = atoi(argv[globalUtilOptind]);
        globalUtilOptind = globalUtilOptind + 1;
        if (fFuncOnly < 1) goto LAB_0023e444;
      }
      else if (iVar1 == 0x66) {
        local_64 = local_64 ^ 1;
      }
      else {
        if ((iVar1 == 0x68) || (iVar1 != 0x76)) goto LAB_0023e444;
        local_68 = local_68 ^ 1;
      }
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
      break;
    }
    fVerbose = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
  } while (0 < fVerbose);
LAB_0023e444:
  Abc_Print(-2,"usage: rec_start3 [-K num] [-C num] [-fvh] <file>\n");
  Abc_Print(-2,"\t         starts recording AIG subgraphs (should be called for\n");
  Abc_Print(-2,"\t         an empty network or after reading in a previous record)\n");
  Abc_Print(-2,"\t-K num : the largest number of inputs [default = %d]\n",(ulong)(uint)fFuncOnly);
  Abc_Print(-2,"\t-C num : the max number of cuts used at a node (0 < num < 2^12) [default = %d]\n",
            (ulong)(uint)fVerbose);
  pcVar2 = "no";
  if (local_64 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-f     : toggles recording functions without AIG subgraphs [default = %s]\n",
            pcVar2);
  pcVar2 = "no";
  if (local_68 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggles additional verbose output [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  Abc_Print(-2,"\t<file> : AIGER file with the library\n");
  return 1;
}

Assistant:

int Abc_CommandRecStart3( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * FileName, * pTemp;
    char ** pArgvNew;
    int c, nArgcNew;
    FILE * pFile;
    Gia_Man_t * pGia = NULL;
    int nVars = 6;
    int nCuts = 32;
    int fFuncOnly = 0;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCfvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nVars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nVars < 1 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCuts = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCuts < 1 )
                goto usage;
            break;
        case 'f':
            fFuncOnly ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( !(nVars >= 3 && nVars <= 16) )
    {
        Abc_Print( -1, "The range of allowed values is 3 <= K <= 16.\n" );
        return 0;
    }
    if ( Abc_NtkRecIsRunning3() )
    {
        Abc_Print( -1, "The AIG subgraph recording is already started.\n" );
        return 0;
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
        Abc_Print( 1, "File name is not given on the command line. Starting a new record.\n" );
    else
    {
        // get the input file name
        FileName = pArgvNew[0];
        // fix the wrong symbol
        for ( pTemp = FileName; *pTemp; pTemp++ )
            if ( *pTemp == '>' )
                *pTemp = '\\';
        if ( (pFile = fopen( FileName, "r" )) == NULL )
        {
            Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
            if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
                Abc_Print( 1, "Did you mean \"%s\"?", FileName );
            Abc_Print( 1, "\n" );
            return 1;
        }
        fclose( pFile );
        pGia = Gia_AigerRead( FileName, 0, 1, 0 );
        if ( pGia == NULL )
        {
            Abc_Print( -1, "Reading AIGER has failed.\n" );
            return 0;
        }
    }
    Abc_NtkRecStart3( pGia, nVars, nCuts, fFuncOnly, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: rec_start3 [-K num] [-C num] [-fvh] <file>\n" );
    Abc_Print( -2, "\t         starts recording AIG subgraphs (should be called for\n" );
    Abc_Print( -2, "\t         an empty network or after reading in a previous record)\n" );
    Abc_Print( -2, "\t-K num : the largest number of inputs [default = %d]\n", nVars );
    Abc_Print( -2, "\t-C num : the max number of cuts used at a node (0 < num < 2^12) [default = %d]\n", nCuts );
    Abc_Print( -2, "\t-f     : toggles recording functions without AIG subgraphs [default = %s]\n", fFuncOnly? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles additional verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : AIGER file with the library\n");
    return 1;
}